

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O0

string_view __thiscall
choc::value::Value::SimpleStringDictionary::getStringForHandle
          (SimpleStringDictionary *this,Handle handle)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  char *pcVar4;
  Handle local_2c;
  SimpleStringDictionary *local_28;
  SimpleStringDictionary *this_local;
  undefined1 auStack_18 [4];
  Handle handle_local;
  
  local_28 = this;
  this_local._4_4_ = handle.handle;
  memset(&local_2c,0,4);
  StringDictionary::Handle::Handle(&local_2c);
  bVar1 = StringDictionary::Handle::operator==((Handle *)((long)&this_local + 4),local_2c);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18);
  }
  else {
    uVar2 = (ulong)this_local._4_4_;
    sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->strings);
    if (sVar3 < uVar2) {
      throwError("Unknown string");
    }
    pcVar4 = std::vector<char,_std::allocator<char>_>::data(&this->strings);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_18,
               pcVar4 + (this_local._4_4_ - 1));
  }
  return _auStack_18;
}

Assistant:

inline std::string_view Value::SimpleStringDictionary::getStringForHandle (Handle handle) const
{
    if (handle == Handle())
        return {};

    if (handle.handle > strings.size())
        throwError ("Unknown string");

    return std::string_view (strings.data() + (handle.handle - 1));
}